

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::reflux(PeleLM *this)

{
  bool bVar1;
  int iVar2;
  size_type i;
  AdvectionForm *pAVar3;
  PeleLM *this_00;
  reference pvVar4;
  ostream *os_;
  BoxArray *rhs;
  long in_RDI;
  Real run_time;
  int IOProc;
  unsigned_long N;
  unsigned_long it;
  int nstate;
  Array4<double> *ssync_1;
  Array4<double> *vsync_1;
  Box *bx_2;
  MFIter mfi_2;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray baf;
  int sigma;
  int istate;
  Array4<double> *ssync;
  Array4<const_double> *rhohalf_1;
  Box *bx_1;
  MFIter mfi_1;
  Array4<const_double> *rhohalf;
  Array4<double> *vsync;
  Box *bx;
  MFIter mfi;
  MultiFab *RhoHalftime;
  Real scale;
  Real dt_crse;
  FluxRegister *fr_visc;
  FluxRegister *fr_adv;
  Real strt_time;
  undefined8 in_stack_fffffffffffff6a8;
  int lev;
  PeleLM *in_stack_fffffffffffff6b0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff6b8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
  *in_stack_fffffffffffff6c0;
  undefined8 in_stack_fffffffffffff6c8;
  int iVar5;
  undefined8 in_stack_fffffffffffff6d0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  undefined4 uVar6;
  Box *in_stack_fffffffffffff6e8;
  FluxRegister *in_stack_fffffffffffff6f0;
  allocator *paVar7;
  anon_class_136_3_b8288683 *in_stack_fffffffffffff6f8;
  Geometry *in_stack_fffffffffffff700;
  Box *box;
  MFIter *in_stack_fffffffffffff710;
  undefined1 *puVar8;
  Print *in_stack_fffffffffffff720;
  NavierStokesBase *in_stack_fffffffffffff8e0;
  double local_6b8;
  int local_6b0;
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [32];
  undefined1 local_660 [4];
  int in_stack_fffffffffffff9a4;
  int in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  string *in_stack_fffffffffffff9b0;
  MultiFab *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c0;
  undefined1 auStack_620 [64];
  int local_5e0;
  ulong local_5d8;
  size_type local_5d0;
  int local_5c4;
  undefined1 local_5c0 [72];
  undefined1 local_578 [64];
  undefined1 *local_538;
  undefined1 local_52c [28];
  undefined1 *local_510;
  MFIter local_508;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_4a8 [5];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  undefined1 local_3d8 [64];
  undefined1 auStack_398 [64];
  int local_358;
  int local_350;
  int local_34c;
  undefined1 local_348 [64];
  undefined1 *local_308;
  undefined1 local_300 [64];
  undefined1 *local_2c0;
  undefined1 local_2b4 [28];
  undefined1 *local_298;
  MFIter local_290;
  undefined1 local_230 [64];
  undefined1 auStack_1f0 [64];
  undefined1 local_1b0 [64];
  undefined1 *local_170;
  undefined1 local_168 [64];
  undefined1 *local_128;
  undefined1 local_11c [28];
  undefined1 *local_100;
  MFIter local_f8;
  MultiFab *local_98;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  double local_30;
  Real local_28;
  FluxRegister *local_20;
  FluxRegister *local_18;
  double local_10;
  
  lev = (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
  iVar5 = *(int *)(in_RDI + 8);
  iVar2 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  if (iVar5 != iVar2) {
    local_10 = amrex::ParallelDescriptor::second();
    local_18 = NavierStokesBase::getAdvFluxReg
                         (&in_stack_fffffffffffff6b0->super_NavierStokesBase,lev);
    local_20 = NavierStokesBase::getViscFluxReg
                         (&in_stack_fffffffffffff6b0->super_NavierStokesBase,lev);
    local_28 = amrex::Amr::dtLevel((Amr *)in_stack_fffffffffffff6b0,lev);
    local_30 = 1.0 / local_28;
    i = in_RDI + 0x10;
    amrex::FluxRegister::Reflux
              (in_stack_fffffffffffff6f0,(MultiFab *)in_stack_fffffffffffff6e8,
               (MultiFab *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (Real)in_stack_fffffffffffff6d8,(int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
               (int)in_stack_fffffffffffff6d0,(int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),
               in_stack_fffffffffffff700);
    if (do_reflux_visc != 0) {
      i = in_RDI + 0x10;
      amrex::FluxRegister::Reflux
                (in_stack_fffffffffffff6f0,(MultiFab *)in_stack_fffffffffffff6e8,
                 (MultiFab *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 (Real)in_stack_fffffffffffff6d8,(int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                 (int)in_stack_fffffffffffff6d0,(int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),
                 in_stack_fffffffffffff700);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"DBGSync",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"sdc_Ssync_inReflux_AftVisc",&local_89);
    amrex::Amr::levelSteps((Amr *)in_stack_fffffffffffff6b0,(int)(i >> 0x20));
    showMF(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
           in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_98 = NavierStokesBase::get_rho_half_time(in_stack_fffffffffffff8e0);
    if (NavierStokesBase::do_mom_diff == 0) {
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 in_stack_fffffffffffff6d8,SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
      while (bVar1 = amrex::MFIter::isValid(&local_f8), bVar1) {
        amrex::MFIter::tilebox(in_stack_fffffffffffff710);
        local_100 = local_11c;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
        local_128 = local_168;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
        local_170 = local_1b0;
        memcpy(local_230,local_128,0x3c);
        memcpy(auStack_1f0,local_170,0x3c);
        amrex::ParallelFor<int,PeleLM::reflux()::__0,void>
                  ((Box *)in_stack_fffffffffffff700,(int)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                   (anon_class_128_2_0bd852d8 *)in_stack_fffffffffffff6f0);
        amrex::MFIter::operator++(&local_f8);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff6b0);
    }
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               in_stack_fffffffffffff6d8,SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
    while( true ) {
      bVar1 = amrex::MFIter::isValid(&local_290);
      iVar5 = (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20);
      if (!bVar1) break;
      amrex::MFIter::tilebox(in_stack_fffffffffffff710);
      local_298 = local_2b4;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
      local_2c0 = local_300;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
      local_308 = local_348;
      for (local_34c = 3; local_34c < NavierStokesBase::NUM_STATE; local_34c = local_34c + 1) {
        pAVar3 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                           ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                            in_stack_fffffffffffff6b0,i);
        if (*pAVar3 == NonConservative) {
          local_350 = local_34c + -3;
          memcpy(local_3d8,local_308,0x3c);
          memcpy(auStack_398,local_2c0,0x3c);
          local_358 = local_350;
          amrex::ParallelFor<PeleLM::reflux()::__1>
                    ((Box *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
        }
      }
      amrex::MFIter::operator++(&local_290);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff6b0);
    rhs = (BoxArray *)(in_RDI + 0x10);
    amrex::FluxRegister::Reflux
              (in_stack_fffffffffffff6f0,(MultiFab *)in_stack_fffffffffffff6e8,
               (MultiFab *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (Real)in_stack_fffffffffffff6d8,(int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
               (int)in_stack_fffffffffffff6d0,iVar5,in_stack_fffffffffffff700);
    amrex::FluxRegister::Reflux
              (in_stack_fffffffffffff6f0,(MultiFab *)in_stack_fffffffffffff6e8,
               (MultiFab *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               (Real)in_stack_fffffffffffff6d8,(int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
               (int)in_stack_fffffffffffff6d0,iVar5,in_stack_fffffffffffff700);
    do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff6d0 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"DBGSync",&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"sdc_Ssync_inReflux_AftAdvReflux",&local_421);
    amrex::Amr::levelSteps((Amr *)in_stack_fffffffffffff6b0,(int)((ulong)rhs >> 0x20));
    showMF(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
           in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    this_00 = getLevel(in_stack_fffffffffffff6b0,(int)((ulong)rhs >> 0x20));
    amrex::AmrLevel::boxArray((AmrLevel *)this_00);
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff6b0,rhs);
    amrex::BoxArray::coarsen
              ((BoxArray *)in_stack_fffffffffffff6f8,(IntVect *)in_stack_fffffffffffff6f0);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x529c46);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               in_stack_fffffffffffff6d8,(bool)do_tiling_);
    while (bVar1 = amrex::MFIter::isValid(&local_508), bVar1) {
      amrex::MFIter::growntilebox
                ((MFIter *)in_stack_fffffffffffff720,(int)((ulong)&local_508 >> 0x20));
      puVar8 = local_578;
      local_510 = local_52c;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
      in_stack_fffffffffffff720 = (Print *)local_5c0;
      local_538 = puVar8;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff6b8,(MFIter *)in_stack_fffffffffffff6b0);
      local_5c4 = NavierStokesBase::NUM_STATE;
      local_5c0._64_8_ = in_stack_fffffffffffff720;
      amrex::BoxArray::intersections
                ((BoxArray *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
      local_5d0 = 0;
      local_5d8 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  size(local_4a8);
      for (; local_5d0 < local_5d8; local_5d0 = local_5d0 + 1) {
        pvVar4 = std::
                 vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                 operator[](local_4a8,local_5d0);
        box = &pvVar4->second;
        memcpy(local_660,local_538,0x3c);
        memcpy(auStack_620,(void *)local_5c0._64_8_,0x3c);
        local_5e0 = local_5c4;
        amrex::ParallelFor<PeleLM::reflux()::__2>
                  (box,(anon_class_136_3_731b4e50 *)in_stack_fffffffffffff6f8);
      }
      amrex::MFIter::operator++(&local_508);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff6b0);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              (in_stack_fffffffffffff6c0);
    paVar7 = &local_681;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_680,"DBGSync",paVar7);
    paVar7 = &local_6a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a8,"sdc_Ssync_inReflux_AftZerosFine",paVar7);
    uVar6 = *(undefined4 *)(in_RDI + 8);
    amrex::Amr::levelSteps((Amr *)in_stack_fffffffffffff6b0,(int)((ulong)rhs >> 0x20));
    showMF(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
           in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    std::__cxx11::string::~string(local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
    std::__cxx11::string::~string(local_680);
    std::allocator<char>::~allocator((allocator<char> *)&local_681);
    if (2 < NavierStokesBase::verbose) {
      local_6b0 = amrex::ParallelDescriptor::IOProcessorNumber();
      local_6b8 = amrex::ParallelDescriptor::second();
      local_6b8 = local_6b8 - local_10;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_6b8,local_6b0);
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)CONCAT44(uVar6,in_stack_fffffffffffff6e0),os_);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff6b0,(char (*) [30])rhs);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff6b0,(int *)rhs);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff6b0,(char (*) [9])rhs);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff6b0,(double *)rhs);
      amrex::Print::operator<<((Print *)in_stack_fffffffffffff6b0,(char *)rhs);
      amrex::Print::~Print(in_stack_fffffffffffff720);
    }
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff6b0);
  }
  return;
}

Assistant:

void
PeleLM::reflux ()
{
   BL_PROFILE("PLM::reflux()");

   // no need to reflux if this is the finest level
   if (level == parent->finestLevel()) return;

   const Real strt_time = ParallelDescriptor::second();

   AMREX_ASSERT(do_reflux);

   //
   // First do refluxing step.
   //
   FluxRegister& fr_adv  = getAdvFluxReg(level+1);
   FluxRegister& fr_visc = getViscFluxReg(level+1);
   const Real    dt_crse = parent->dtLevel(level);
   const Real    scale   = 1.0/dt_crse;
   //
   // It is important, for do_mom_diff == 0, to do the viscous
   //   refluxing first, since this will be divided by rho_half
   //   before the advective refluxing is added.  In the case of
   //   do_mom_diff == 1, both components of the refluxing will
   //   be divided by rho^(n+1) in NavierStokesBase::level_sync.
   //
   // take divergence of diffusive flux registers into cell-centered RHS
   fr_visc.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   if (do_reflux_visc)
     fr_visc.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);

   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftVisc",level,parent->levelSteps(level));

   const MultiFab& RhoHalftime = get_rho_half_time();

   if (do_mom_diff == 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& rhohalf = RhoHalftime.const_array(mfi);

         amrex::ParallelFor(bx, AMREX_SPACEDIM, [vsync, rhohalf]
         AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
         {
            vsync(i,j,k,n) /= rhohalf(i,j,k);
         });
      }
   }

   // for any variables that used non-conservative advective differencing,
   // divide the sync by rhohalf
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Ssync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhohalf = RhoHalftime.const_array(mfi);
      auto const& ssync   = Ssync.array(mfi);
      for (int istate = AMREX_SPACEDIM; istate < NUM_STATE; istate++)
      {
         if (advectionType[istate] == NonConservative)
         {
            const int sigma = istate - AMREX_SPACEDIM;
            amrex::ParallelFor(bx, [ssync, rhohalf, sigma]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               ssync(i,j,k,sigma) /= rhohalf(i,j,k);
            });
         }
      }
   }

   // take divergence of advective flux registers into cell-centered RHS
   fr_adv.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   fr_adv.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftAdvReflux",level,parent->levelSteps(level));

   //
   // This is necessary in order to zero out the contribution to any
   // coarse grid cells which underlie fine grid cells.
   //
   BoxArray baf = getLevel(level+1).boxArray();
   baf.coarsen(fine_ratio);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      std::vector< std::pair<int,Box> > isects;
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.growntilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& ssync   = Ssync.array(mfi);
         int nstate          = NUM_STATE;

         baf.intersections(bx,isects);

         for (long unsigned int it = 0, N = isects.size(); it < N; it++) {
            amrex::ParallelFor(isects[it].second, [vsync, ssync, nstate]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               for (int n = 0; n < AMREX_SPACEDIM; n++) {
                  vsync(i,j,k,n) = 0.0;
               }
               for (int n = 0; n < nstate-AMREX_SPACEDIM; n++) {
                  ssync(i,j,k,n) = 0.0;
               }
            });
         }
      }
   }
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftZerosFine",level,parent->levelSteps(level));

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::Reflux(): lev: " << level << ", time: " << run_time << '\n';
   }
}